

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall
helics::apps::Connector::makeConnections(Connector *this,ConnectionsList *possibleConnections)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList;
  element_type *peVar1;
  _func_int *p_Var2;
  string_view *psVar3;
  uint uVar4;
  int iVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  basic_string_view<char,_std::char_traits<char>_> *uInp;
  string_view *psVar6;
  string_view message;
  format_args args;
  string_view fmt;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  uint64_t local_48 [3];
  
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (peVar1->super_ValueFederate)._vptr_ValueFederate[-3];
  uVar4 = (**(code **)(*(long *)((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
                                (long)p_Var2) + 0x48))
                    ((_func_int *)
                     ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate + (long)p_Var2),0x10f
                    );
  tagList = &possibleConnections->tagCodes;
  psVar3 = (possibleConnections->unconnectedInputs).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (possibleConnections->unconnectedInputs).
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar3; psVar6 = psVar6 + 1) {
    local_68._12_4_ = 0;
    local_68._8_4_ = uVar4;
    local_50 = CLI::std::
               _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1193:27)>
               ::_M_invoke;
    local_58 = CLI::std::
               _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1193:27)>
               ::_M_manager;
    in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)possibleConnections;
    local_68._M_unused._M_object = this;
    iVar5 = makeTargetConnection
                      (this,*psVar6,tagList,&possibleConnections->pubs,&possibleConnections->aliases
                       ,(function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                         *)&local_68);
    this->matchCount = this->matchCount + (long)iVar5;
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_68);
  }
  psVar3 = (possibleConnections->unconnectedPubs).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (possibleConnections->unconnectedPubs).
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar3; psVar6 = psVar6 + 1) {
    local_68._12_4_ = 0;
    local_68._8_4_ = uVar4;
    local_50 = CLI::std::
               _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1200:25)>
               ::_M_invoke;
    local_58 = CLI::std::
               _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1200:25)>
               ::_M_manager;
    in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)possibleConnections;
    local_68._M_unused._M_object = this;
    iVar5 = makeTargetConnection
                      (this,*psVar6,tagList,&possibleConnections->inputs,
                       &possibleConnections->aliases,
                       (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)&local_68);
    this->matchCount = this->matchCount + (long)iVar5;
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_68);
  }
  psVar3 = (possibleConnections->unconnectedSourceEndpoints).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (possibleConnections->unconnectedSourceEndpoints).
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar3; psVar6 = psVar6 + 1) {
    local_68._12_4_ = 0;
    local_68._8_4_ = uVar4;
    local_50 = CLI::std::
               _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1207:36)>
               ::_M_invoke;
    local_58 = CLI::std::
               _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1207:36)>
               ::_M_manager;
    in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)possibleConnections;
    local_68._M_unused._M_object = this;
    iVar5 = makeTargetConnection
                      (this,*psVar6,tagList,&possibleConnections->endpoints,
                       &possibleConnections->aliases,
                       (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)&local_68);
    this->matchCount = this->matchCount + (long)iVar5;
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_68);
  }
  if (this->matchTargetEndpoints != false) {
    psVar3 = (possibleConnections->unconnectedTargetEndpoints).
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar6 = (possibleConnections->unconnectedTargetEndpoints).
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar3; psVar6 = psVar6 + 1)
    {
      local_68._12_4_ = 0;
      local_68._8_4_ = uVar4;
      local_50 = CLI::std::
                 _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1217:36)>
                 ::_M_invoke;
      local_58 = CLI::std::
                 _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1217:36)>
                 ::_M_manager;
      in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
              possibleConnections;
      local_68._M_unused._M_object = this;
      iVar5 = makeTargetConnection
                        (this,*psVar6,tagList,&possibleConnections->endpoints,
                         &possibleConnections->aliases,
                         (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)&local_68);
      this->matchCount = this->matchCount + (long)iVar5;
      CLI::std::_Function_base::~_Function_base((_Function_base *)&local_68);
    }
  }
  if (5 < (int)uVar4) {
    peVar1 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (peVar1->super_ValueFederate)._vptr_ValueFederate[-3];
    local_48[0] = this->matchCount;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_48;
    fmt.size_ = 4;
    fmt.data_ = (char *)0x13;
    ::fmt::v11::vformat_abi_cxx11_((string *)&local_68,(v11 *)"{} connections made",fmt,args);
    message._M_str = (char *)local_68._M_unused._0_8_;
    message._M_len = local_68._8_8_;
    Federate::logInfoMessage
              ((Federate *)((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate + (long)p_Var2)
               ,message);
    std::__cxx11::string::~string((string *)local_68._M_pod_data);
  }
  return;
}

Assistant:

void Connector::makeConnections(ConnectionsList& possibleConnections)
{
    const int logLevel = fed->getIntegerProperty(HELICS_PROPERTY_INT_LOG_LEVEL);
    auto inputConnector = [this, logLevel](std::string_view target, std::string_view source) {
        core.dataLink(source, target);
        if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
            fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                            fmt::format("connecting input {} to publication {}", target, source));
        }
    };
    auto pubConnector = [this, logLevel](std::string_view source, std::string_view target) {
        core.dataLink(source, target);
        if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
            fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                            fmt::format("connecting publication {} to input {}", source, target));
        }
    };
    auto sourceEndpointConnector = [this, logLevel](std::string_view source,
                                                    std::string_view target) {
        core.linkEndpoints(source, target);
        if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
            fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                            fmt::format("connecting source endpoint {} to target endpoint {}",
                                        source,
                                        target));
        }
    };
    auto targetEndpointConnector = [this, logLevel](std::string_view target,
                                                    std::string_view source) {
        core.linkEndpoints(source, target);
        if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
            fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                            fmt::format("connecting target endpoint {} to source endpoint {}",
                                        target,
                                        source));
        }
    };

    const auto& tagList = possibleConnections.tagCodes;
    /** unconnected inputs*/
    for (const auto& uInp : possibleConnections.unconnectedInputs) {
        matchCount += makeTargetConnection(
            uInp, tagList, possibleConnections.pubs, possibleConnections.aliases, inputConnector);
    }
    /** unconnected publications*/
    for (const auto& uPub : possibleConnections.unconnectedPubs) {
        matchCount += makeTargetConnection(
            uPub, tagList, possibleConnections.inputs, possibleConnections.aliases, pubConnector);
    }

    /** unconnected source endpoints*/
    for (const auto& uEnd : possibleConnections.unconnectedSourceEndpoints) {
        matchCount += makeTargetConnection(uEnd,
                                           tagList,
                                           possibleConnections.endpoints,
                                           possibleConnections.aliases,
                                           sourceEndpointConnector);
    }

    if (matchTargetEndpoints) {
        /** unconnected target endpoints*/
        for (const auto& uEnd : possibleConnections.unconnectedTargetEndpoints) {
            matchCount += makeTargetConnection(uEnd,
                                               tagList,
                                               possibleConnections.endpoints,
                                               possibleConnections.aliases,
                                               targetEndpointConnector);
        }
    }
    if (logLevel >= HELICS_LOG_LEVEL_SUMMARY) {
        fed->logInfoMessage(fmt::format("{} connections made", matchCount));
    }
}